

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_sBIT(png_structrp png_ptr,png_const_color_8p sbit,int color_type)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 in_RAX;
  byte bVar5;
  size_t length;
  png_byte buf [4];
  undefined8 uStack_8;
  
  uStack_8._5_3_ = (undefined3)((ulong)in_RAX >> 0x28);
  uStack_8._0_4_ = (undefined4)in_RAX;
  if ((color_type & 2U) == 0) {
    bVar5 = sbit->gray;
    uVar4 = in_RAX;
    if ((bVar5 == 0) || (uVar4 = in_RAX, png_ptr->usr_bit_depth < bVar5)) goto LAB_00122486;
    uStack_8._0_5_ = CONCAT14(bVar5,(undefined4)uStack_8);
    length = 1;
  }
  else {
    bVar5 = 8;
    if (color_type != 3) {
      bVar5 = png_ptr->usr_bit_depth;
    }
    bVar1 = sbit->red;
    uVar4 = in_RAX;
    if (((bVar5 < bVar1 || bVar1 == 0) ||
        (bVar2 = sbit->green, uVar4 = in_RAX, bVar5 < bVar2 || bVar2 == 0)) ||
       (bVar3 = sbit->blue, uVar4 = in_RAX, bVar5 < bVar3 || bVar3 == 0)) goto LAB_00122486;
    uStack_8._0_5_ = CONCAT14(bVar1,(undefined4)uStack_8);
    uStack_8._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
    uStack_8._0_7_ = CONCAT16(bVar3,CONCAT15(bVar2,(undefined5)uStack_8));
    length = 3;
  }
  if ((color_type & 4U) != 0) {
    bVar5 = sbit->alpha;
    uVar4 = uStack_8;
    if ((bVar5 == 0) || (png_ptr->usr_bit_depth < bVar5)) {
LAB_00122486:
      uStack_8 = uVar4;
      png_warning(png_ptr,"Invalid sBIT depth specified");
      return;
    }
    *(byte *)((long)&uStack_8 + length + 4) = bVar5;
    length = length + 1;
  }
  png_write_complete_chunk(png_ptr,0x73424954,(png_const_bytep)((long)&uStack_8 + 4),length);
  return;
}

Assistant:

void /* PRIVATE */
png_write_sBIT(png_structrp png_ptr, png_const_color_8p sbit, int color_type)
{
   png_byte buf[4];
   size_t size;

   png_debug(1, "in png_write_sBIT");

   /* Make sure we don't depend upon the order of PNG_COLOR_8 */
   if ((color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_byte maxbits;

      maxbits = (png_byte)(color_type==PNG_COLOR_TYPE_PALETTE ? 8 :
          png_ptr->usr_bit_depth);

      if (sbit->red == 0 || sbit->red > maxbits ||
          sbit->green == 0 || sbit->green > maxbits ||
          sbit->blue == 0 || sbit->blue > maxbits)
      {
         png_warning(png_ptr, "Invalid sBIT depth specified");
         return;
      }

      buf[0] = sbit->red;
      buf[1] = sbit->green;
      buf[2] = sbit->blue;
      size = 3;
   }

   else
   {
      if (sbit->gray == 0 || sbit->gray > png_ptr->usr_bit_depth)
      {
         png_warning(png_ptr, "Invalid sBIT depth specified");
         return;
      }

      buf[0] = sbit->gray;
      size = 1;
   }

   if ((color_type & PNG_COLOR_MASK_ALPHA) != 0)
   {
      if (sbit->alpha == 0 || sbit->alpha > png_ptr->usr_bit_depth)
      {
         png_warning(png_ptr, "Invalid sBIT depth specified");
         return;
      }

      buf[size++] = sbit->alpha;
   }

   png_write_complete_chunk(png_ptr, png_sBIT, buf, size);
}